

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O3

int decoder_get_length(ndn_decoder_t *decoder,uint32_t *length)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  
  puVar3 = decoder->input_value;
  uVar2 = decoder->offset;
  bVar1 = puVar3[uVar2];
  uVar4 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    puVar3 = (uint8_t *)0x1;
  }
  else {
    uVar5 = decoder->input_size - uVar2;
    if (uVar5 < 3 || bVar1 != 0xfd) {
      if (uVar5 < 5 || uVar4 != 0xfe) goto LAB_00104755;
      uVar4 = (uint)puVar3[uVar2 + 4] |
              (uint)puVar3[uVar2 + 3] << 8 |
              (uint)puVar3[uVar2 + 2] << 0x10 | (uint)puVar3[uVar2 + 1] << 0x18;
      puVar3 = (uint8_t *)0x5;
    }
    else {
      uVar4 = (uint)CONCAT11(puVar3[uVar2 + 1],puVar3[uVar2 + 2]);
      puVar3 = (uint8_t *)0x3;
    }
  }
  *length = uVar4;
  decoder->offset = decoder->offset + (int)puVar3;
LAB_00104755:
  return (int)puVar3;
}

Assistant:

static inline int
decoder_get_length(ndn_decoder_t* decoder, uint32_t* length)
{
  return decoder_get_var(decoder, length);
}